

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O1

CookieInfo * Curl_cookie_init(Curl_easy *data,char *file,CookieInfo *ci,_Bool newsession)

{
  undefined1 *puVar1;
  curl_trc_feat *pcVar2;
  int iVar3;
  FILE *input;
  long lVar4;
  char *lineptr;
  FILE *local_58;
  dynbuf buf;
  
  if (ci == (CookieInfo *)0x0) {
    ci = (CookieInfo *)(*Curl_ccalloc)(1,0x7f8);
    if (ci == (CookieInfo *)0x0) {
      return (CookieInfo *)0x0;
    }
    lVar4 = 0;
    do {
      Curl_llist_init((Curl_llist *)((long)&ci->cookielist[0]._head + lVar4),(Curl_llist_dtor)0x0);
      lVar4 = lVar4 + 0x20;
    } while (lVar4 != 0x7e0);
    ci->next_expiration = 0x7fffffffffffffff;
    if (ci == (CookieInfo *)0x0) {
      return (CookieInfo *)0x0;
    }
  }
  ci->field_0x7f0 = ci->field_0x7f0 & 0xfd | newsession * '\x02';
  if (data == (Curl_easy *)0x0) goto LAB_0011e37f;
  if ((file == (char *)0x0) || (*file == '\0')) {
LAB_0011e2a6:
    local_58 = (FILE *)0x0;
    input = (FILE *)0x0;
  }
  else {
    iVar3 = strcmp(file,"-");
    if (iVar3 == 0) {
      local_58 = (FILE *)0x0;
      input = _stdin;
    }
    else {
      local_58 = fopen64(file,"rb");
      input = local_58;
      if (local_58 == (FILE *)0x0) {
        if ((((data->set).field_0x89f & 0x40) != 0) &&
           ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))
           )) {
          Curl_infof(data,"WARNING: failed to open cookie file \"%s\"",file);
        }
        goto LAB_0011e2a6;
      }
    }
  }
  ci->field_0x7f0 = ci->field_0x7f0 & 0xfe;
  if (input != (FILE *)0x0) {
    Curl_dyn_init(&buf,5000);
    iVar3 = Curl_get_line(&buf,(FILE *)input);
    if (iVar3 != 0) {
      do {
        lineptr = Curl_dyn_ptr(&buf);
        iVar3 = curl_strnequal(lineptr,"Set-Cookie:",0xb);
        if (iVar3 != 0) {
          lineptr = lineptr + 0xb;
          Curl_str_passblanks(&lineptr);
        }
        Curl_cookie_add(data,ci,iVar3 != 0,true,lineptr,(char *)0x0,(char *)0x0,true);
        iVar3 = Curl_get_line(&buf,(FILE *)input);
      } while (iVar3 != 0);
    }
    Curl_dyn_free(&buf);
    remove_expired(ci);
    if (local_58 != (FILE *)0x0) {
      fclose(local_58);
    }
  }
  puVar1 = &(data->state).field_0x7bf;
  *puVar1 = *puVar1 | 0x20;
LAB_0011e37f:
  ci->field_0x7f0 = ci->field_0x7f0 | 1;
  return ci;
}

Assistant:

struct CookieInfo *Curl_cookie_init(struct Curl_easy *data,
                                    const char *file,
                                    struct CookieInfo *ci,
                                    bool newsession)
{
  FILE *handle = NULL;

  if(!ci) {
    int i;

    /* we did not get a struct, create one */
    ci = calloc(1, sizeof(struct CookieInfo));
    if(!ci)
      return NULL; /* failed to get memory */

    /* This does not use the destructor callback since we want to add
       and remove to lists while keeping the cookie struct intact */
    for(i = 0; i < COOKIE_HASH_SIZE; i++)
      Curl_llist_init(&ci->cookielist[i], NULL);
    /*
     * Initialize the next_expiration time to signal that we do not have enough
     * information yet.
     */
    ci->next_expiration = CURL_OFF_T_MAX;
  }
  ci->newsession = newsession; /* new session? */

  if(data) {
    FILE *fp = NULL;
    if(file && *file) {
      if(!strcmp(file, "-"))
        fp = stdin;
      else {
        fp = fopen(file, "rb");
        if(!fp)
          infof(data, "WARNING: failed to open cookie file \"%s\"", file);
        else
          handle = fp;
      }
    }

    ci->running = FALSE; /* this is not running, this is init */
    if(fp) {
      struct dynbuf buf;
      Curl_dyn_init(&buf, MAX_COOKIE_LINE);
      while(Curl_get_line(&buf, fp)) {
        const char *lineptr = Curl_dyn_ptr(&buf);
        bool headerline = FALSE;
        if(checkprefix("Set-Cookie:", lineptr)) {
          /* This is a cookie line, get it! */
          lineptr += 11;
          headerline = TRUE;
          Curl_str_passblanks(&lineptr);
        }

        Curl_cookie_add(data, ci, headerline, TRUE, lineptr, NULL, NULL, TRUE);
      }
      Curl_dyn_free(&buf); /* free the line buffer */

      /*
       * Remove expired cookies from the hash. We must make sure to run this
       * after reading the file, and not on every cookie.
       */
      remove_expired(ci);

      if(handle)
        fclose(handle);
    }
    data->state.cookie_engine = TRUE;
  }
  ci->running = TRUE;          /* now, we are running */

  return ci;
}